

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

void __thiscall
wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::setGlobalValue
          (ConstantExpressionRunner<wasm::CExpressionRunner> *this,Name name,Literals *values)

{
  SmallVector<wasm::Literal,_1UL> *this_00;
  undefined1 local_20 [8];
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  local_20 = name.super_IString.str._M_len;
  if (((long)(values->super_SmallVector<wasm::Literal,_1UL>).flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(values->super_SmallVector<wasm::Literal,_1UL>).flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_start) / 0x18 +
      (values->super_SmallVector<wasm::Literal,_1UL>).usedFixed != 0) {
    this_00 = &std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literals>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literals>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->globalValues,(key_type *)local_20)->
               super_SmallVector<wasm::Literal,_1UL>;
    SmallVector<wasm::Literal,_1UL>::operator=
              (this_00,&values->super_SmallVector<wasm::Literal,_1UL>);
    return;
  }
  __assert_fail("values.isConcrete()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                ,0x9ad,
                "void wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::setGlobalValue(Name, Literals &) [SubType = wasm::CExpressionRunner]"
               );
}

Assistant:

void setGlobalValue(Name name, Literals& values) {
    assert(values.isConcrete());
    globalValues[name] = values;
  }